

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int experimental_utilization_batch_query_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 0x16;
  if (((newlen & 7) == 0 &&
       (newlen != 0 && (newp != (void *)0x0 && (oldlenp != (size_t *)0x0 && oldp != (void *)0x0))))
     && (*oldlenp == (newlen >> 3) * 0x18)) {
    iVar2 = 0;
    uVar1 = 0;
    do {
      duckdb_je_inspect_extent_util_stats_get
                ((tsdn_t *)tsd,*(void **)((long)newp + uVar1 * 8),(size_t *)oldp,
                 (size_t *)((long)oldp + 8),(size_t *)((long)oldp + 0x10));
      uVar1 = uVar1 + 1;
      oldp = (void *)((long)oldp + 0x18);
    } while (newlen >> 3 != uVar1);
  }
  return iVar2;
}

Assistant:

static int
experimental_utilization_batch_query_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	assert(sizeof(inspect_extent_util_stats_t) == sizeof(size_t) * 3);

	const size_t len = newlen / sizeof(const void *);
	if (oldp == NULL || oldlenp == NULL || newp == NULL || newlen == 0
	    || newlen != len * sizeof(const void *)
	    || *oldlenp != len * sizeof(inspect_extent_util_stats_t)) {
		ret = EINVAL;
		goto label_return;
	}

	void **ptrs = (void **)newp;
	inspect_extent_util_stats_t *util_stats =
	    (inspect_extent_util_stats_t *)oldp;
	size_t i;
	for (i = 0; i < len; ++i) {
		inspect_extent_util_stats_get(tsd_tsdn(tsd), ptrs[i],
		    &util_stats[i].nfree, &util_stats[i].nregs,
		    &util_stats[i].size);
	}
	ret = 0;

label_return:
	return ret;
}